

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::~QToolBarLayout(QToolBarLayout *this)

{
  int iVar1;
  value_type pQVar2;
  QWidgetAction *this_00;
  undefined4 extraout_var;
  
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007d7fc8;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QToolBarLayout_007d80d0;
  while ((this->items).d.size != 0) {
    pQVar2 = QList<QToolBarItem_*>::takeFirst(&this->items);
    this_00 = QtPrivate::qobject_cast_helper<QWidgetAction*,QObject>((QObject *)pQVar2->action);
    if ((this_00 != (QWidgetAction *)0x0) && (pQVar2->customWidget == true)) {
      iVar1 = (*(pQVar2->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar2);
      QWidgetAction::releaseWidget(this_00,(QWidget *)CONCAT44(extraout_var,iVar1));
    }
    (*(pQVar2->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[1])(pQVar2);
  }
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&(this->geomArray).d);
  QArrayDataPointer<QToolBarItem_*>::~QArrayDataPointer(&(this->items).d);
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

QToolBarLayout::~QToolBarLayout()
{
    while (!items.isEmpty()) {
        QToolBarItem *item = items.takeFirst();
        if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action)) {
            if (item->customWidget)
                widgetAction->releaseWidget(item->widget());
        }
        delete item;
    }
}